

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_dischargevars(FuncState *fs,expdesc *e)

{
  Vardesc *pVVar1;
  int iVar2;
  byte bVar3;
  Instruction i;
  
  switch(e->k) {
  case VLOCAL:
    *(uint *)&e->u = (uint)(e->u).var.ridx;
    e->k = VNONRELOC;
    return;
  case VUPVAL:
    i = (e->u).info << 0x10 | 9;
    break;
  case VCONST:
    pVVar1 = (fs->ls->dyd->actvar).arr + (e->u).info;
    bVar3 = *(byte *)((long)pVVar1 + 8) & 0x3f;
    if (bVar3 < 0x11) {
      switch(bVar3) {
      case 0:
        e->k = VNIL;
        return;
      case 1:
        e->k = VFALSE;
        return;
      default:
        return;
      case 3:
        e->k = VKINT;
        goto LAB_00159fc0;
      case 4:
        goto switchD_00159edc_caseD_4;
      }
    }
    if (bVar3 == 0x11) {
      e->k = VTRUE;
      return;
    }
    if (bVar3 == 0x13) {
      e->k = VKFLT;
      e->u = (anon_union_8_6_45a55102_for_u)(pVVar1->vd).value_;
      return;
    }
    if (bVar3 != 0x14) {
      return;
    }
switchD_00159edc_caseD_4:
    e->k = VKSTR;
LAB_00159fc0:
    e->u = (anon_union_8_6_45a55102_for_u)(pVVar1->vd).value_;
    return;
  case VINDEXED:
    freeregs(fs,(uint)(e->u).ind.t,(int)(e->u).ind.idx);
    i = (uint)(e->u).ind.t * 0x10000 + (e->u).info * 0x1000000 + 0xc;
    break;
  case VINDEXUP:
    i = (uint)(e->u).ind.t * 0x10000 + (e->u).info * 0x1000000 + 0xb;
    break;
  case VINDEXI:
    bVar3 = (e->u).ind.t;
    iVar2 = luaY_nvarstack(fs);
    if (iVar2 <= (int)(uint)bVar3) {
      fs->freereg = fs->freereg + 0xff;
    }
    i = (uint)(e->u).ind.t * 0x10000 + (e->u).info * 0x1000000 + 0xd;
    break;
  case VINDEXSTR:
    bVar3 = (e->u).ind.t;
    iVar2 = luaY_nvarstack(fs);
    if (iVar2 <= (int)(uint)bVar3) {
      fs->freereg = fs->freereg + 0xff;
    }
    i = (uint)(e->u).ind.t * 0x10000 + (e->u).info * 0x1000000 + 0xe;
    break;
  default:
    goto switchD_00159e8b_caseD_10;
  case VCALL:
  case VVARARG:
    luaK_setoneret(fs,e);
    return;
  }
  iVar2 = luaK_code(fs,i);
  (e->u).info = iVar2;
  e->k = VRELOC;
switchD_00159e8b_caseD_10:
  return;
}

Assistant:

void luaK_dischargevars (FuncState *fs, expdesc *e) {
  switch (e->k) {
    case VCONST: {
      const2exp(const2val(fs, e), e);
      break;
    }
    case VLOCAL: {  /* already in a register */
      int temp = e->u.var.ridx;
      e->u.info = temp;  /* (can't do a direct assignment; values overlap) */
      e->k = VNONRELOC;  /* becomes a non-relocatable value */
      break;
    }
    case VUPVAL: {  /* move value to some (pending) register */
      e->u.info = luaK_codeABC(fs, OP_GETUPVAL, 0, e->u.info, 0);
      e->k = VRELOC;
      break;
    }
    case VINDEXUP: {
      e->u.info = luaK_codeABC(fs, OP_GETTABUP, 0, e->u.ind.t, e->u.ind.idx);
      e->k = VRELOC;
      break;
    }
    case VINDEXI: {
      freereg(fs, e->u.ind.t);
      e->u.info = luaK_codeABC(fs, OP_GETI, 0, e->u.ind.t, e->u.ind.idx);
      e->k = VRELOC;
      break;
    }
    case VINDEXSTR: {
      freereg(fs, e->u.ind.t);
      e->u.info = luaK_codeABC(fs, OP_GETFIELD, 0, e->u.ind.t, e->u.ind.idx);
      e->k = VRELOC;
      break;
    }
    case VINDEXED: {
      freeregs(fs, e->u.ind.t, e->u.ind.idx);
      e->u.info = luaK_codeABC(fs, OP_GETTABLE, 0, e->u.ind.t, e->u.ind.idx);
      e->k = VRELOC;
      break;
    }
    case VVARARG: case VCALL: {
      luaK_setoneret(fs, e);
      break;
    }
    default: break;  /* there is one value available (somewhere) */
  }
}